

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderCommonFunctionTests.cpp
# Opt level: O1

bool __thiscall
vkt::shaderexecutor::anon_unknown_0::FloatBitsToUintIntCaseInstance::compare
          (FloatBitsToUintIntCaseInstance *this,void **inputs,void **outputs)

{
  pointer pSVar1;
  uint uVar2;
  int iVar3;
  ostream *poVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ostringstream *this_00;
  long lVar9;
  Hex<8UL> local_38;
  
  pSVar1 = (this->super_CommonFunctionTestInstance).m_spec.inputs.
           super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar8 = *(uint *)((long)&(pSVar1->varType).m_data + 4);
  iVar3 = glu::getDataTypeScalarSize((pSVar1->varType).m_data.basic.type);
  bVar5 = iVar3 < 1;
  if (0 < iVar3) {
    uVar6 = ~(-1 << (0x17 - (&DAT_00b5844c)[(ulong)uVar8 * 4] & 0x1f));
    uVar8 = **inputs;
    uVar7 = **outputs - uVar8;
    uVar2 = -uVar7;
    if (0 < (int)uVar7) {
      uVar2 = uVar7;
    }
    lVar9 = 0;
    if ((int)uVar2 <= (int)uVar6) {
      lVar9 = 0;
      do {
        if (iVar3 + -1 == (int)lVar9) {
          return true;
        }
        uVar8 = *(uint *)((long)*inputs + (lVar9 + 1) * 4);
        uVar7 = *(int *)((long)*outputs + (lVar9 + 1) * 4) - uVar8;
        uVar2 = -uVar7;
        if (0 < (int)uVar7) {
          uVar2 = uVar7;
        }
        lVar9 = lVar9 + 1;
      } while ((int)uVar2 <= (int)uVar6);
      bVar5 = iVar3 <= (int)lVar9;
    }
    this_00 = &(this->super_CommonFunctionTestInstance).m_failMsg;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Expected [",10);
    poVar4 = (ostream *)std::ostream::operator<<(this_00,(int)lVar9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"] = ",4);
    local_38.value = (deUint64)uVar8;
    poVar4 = tcu::Format::Hex<8UL>::toStream(&local_38,poVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," with threshold ",0x10);
    local_38.value = (deUint64)uVar6;
    poVar4 = tcu::Format::Hex<8UL>::toStream(&local_38,poVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,", got diff ",0xb);
    local_38.value = (ulong)uVar2;
    tcu::Format::Hex<8UL>::toStream(&local_38,poVar4);
  }
  return bVar5;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);

		const int				mantissaBits	= getMinMantissaBits(precision);
		const int				maxUlpDiff		= getMaxUlpDiffFromBits(mantissaBits);

		for (int compNdx = 0; compNdx < scalarSize; compNdx++)
		{
			const float		in0			= ((const float*)inputs[0])[compNdx];
			const deUint32	out0		= ((const deUint32*)outputs[0])[compNdx];
			const deUint32	refOut0		= tcu::Float32(in0).bits();
			const int		ulpDiff		= de::abs((int)out0 - (int)refOut0);

			if (ulpDiff > maxUlpDiff)
			{
				m_failMsg << "Expected [" << compNdx << "] = " << tcu::toHex(refOut0) << " with threshold "
							<< tcu::toHex(maxUlpDiff) << ", got diff " << tcu::toHex(ulpDiff);
				return false;
			}
		}

		return true;
	}